

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

uint __thiscall Assimp::FBX::MeshGeometry::FaceForVertexIndex(MeshGeometry *this,uint in_index)

{
  pointer *ppuVar1;
  uint *puVar2;
  pointer puVar3;
  uint *puVar4;
  ulong uVar5;
  uint *puVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  value_type_conflict1 local_1c;
  
  uVar5 = ((long)(this->m_vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->m_vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if (uVar5 < in_index || uVar5 - in_index == 0) {
    __assert_fail("in_index < m_vertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXMeshGeometry.cpp"
                  ,0x101,
                  "unsigned int Assimp::FBX::MeshGeometry::FaceForVertexIndex(unsigned int) const");
  }
  if ((this->m_facesVertexStartIndices).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_facesVertexStartIndices).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_facesVertexStartIndices,
               ((long)(this->m_faces).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_faces).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) + 1,&local_1c);
    puVar4 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar2 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (puVar4 != puVar2) {
      puVar3 = (this->m_facesVertexStartIndices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = *puVar4;
      puVar3[1] = uVar8;
      puVar4 = puVar4 + 1;
      if (puVar4 != puVar2) {
        puVar6 = puVar3 + 2;
        do {
          uVar8 = uVar8 + *puVar4;
          *puVar6 = uVar8;
          puVar4 = puVar4 + 1;
          puVar6 = puVar6 + 1;
        } while (puVar4 != puVar2);
      }
    }
    ppuVar1 = &(this->m_facesVertexStartIndices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
  }
  puVar4 = (this->m_facesVertexStartIndices).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(this->m_facesVertexStartIndices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar7 == (long)(this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
    puVar2 = puVar4;
    uVar5 = lVar7 >> 2;
    while (puVar6 = puVar2, 0 < (long)uVar5) {
      uVar9 = uVar5 >> 1;
      uVar5 = ~uVar9 + uVar5;
      puVar2 = puVar6 + uVar9 + 1;
      if (in_index < puVar6[uVar9]) {
        puVar2 = puVar6;
        uVar5 = uVar9;
      }
    }
    return (uint)((ulong)((long)puVar6 + (-4 - (long)puVar4)) >> 2);
  }
  __assert_fail("m_facesVertexStartIndices.size() == m_faces.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXMeshGeometry.cpp"
                ,0x10c,
                "unsigned int Assimp::FBX::MeshGeometry::FaceForVertexIndex(unsigned int) const");
}

Assistant:

unsigned int MeshGeometry::FaceForVertexIndex( unsigned int in_index ) const {
    ai_assert( in_index < m_vertices.size() );

    // in the current conversion pattern this will only be needed if
    // weights are present, so no need to always pre-compute this table
    if ( m_facesVertexStartIndices.empty() ) {
        m_facesVertexStartIndices.resize( m_faces.size() + 1, 0 );

        std::partial_sum( m_faces.begin(), m_faces.end(), m_facesVertexStartIndices.begin() + 1 );
        m_facesVertexStartIndices.pop_back();
    }

    ai_assert( m_facesVertexStartIndices.size() == m_faces.size() );
    const std::vector<unsigned int>::iterator it = std::upper_bound(
        m_facesVertexStartIndices.begin(),
        m_facesVertexStartIndices.end(),
        in_index
        );

    return static_cast< unsigned int >( std::distance( m_facesVertexStartIndices.begin(), it - 1 ) );
}